

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::checkSIprefix(string *unit_string,uint64_t match_flags)

{
  char cVar1;
  precise_unit pVar2;
  precise_unit pVar3;
  bool bVar4;
  size_type sVar5;
  const_reference pvVar6;
  reference pvVar7;
  ulong in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  double dVar8;
  precise_unit pVar9;
  precise_unit pVar10;
  precise_unit pVar11;
  precise_unit retunit_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ustring_2;
  double mux_2;
  precise_unit retunit_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ustring_1;
  double mux_1;
  value_type c;
  precise_unit retunit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ustring;
  double mux;
  bool threeAgain;
  undefined7 in_stack_fffffffffffffe58;
  char in_stack_fffffffffffffe5f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  double in_stack_fffffffffffffe68;
  undefined6 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe76;
  value_type vVar12;
  undefined1 in_stack_fffffffffffffe77;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  double local_170;
  undefined6 in_stack_fffffffffffffe98;
  char in_stack_fffffffffffffe9e;
  char in_stack_fffffffffffffe9f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  double in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  double local_a0;
  char local_95;
  precise_unit local_68;
  int local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  double local_30;
  byte local_21;
  ulong local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  double local_10;
  undefined8 local_8;
  
  local_21 = 0;
  local_20 = in_RSI;
  local_18 = in_RDI;
  sVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_RDI);
  pVar10.base_units_ = local_68.base_units_;
  pVar10.commodity_ = local_68.commodity_;
  pVar10.multiplier_ = local_68.multiplier_;
  pVar9._8_8_ = in_stack_fffffffffffffea0;
  pVar9.multiplier_ = in_stack_fffffffffffffea8;
  if (2 < sVar5) {
    pvVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](in_stack_fffffffffffffe60,
                        CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
    pVar10.base_units_ = local_68.base_units_;
    pVar10.commodity_ = local_68.commodity_;
    pVar10.multiplier_ = local_68.multiplier_;
    pVar9._8_8_ = in_stack_fffffffffffffea0;
    pVar9.multiplier_ = in_stack_fffffffffffffea8;
    if (*pvVar6 == 'A') {
      local_21 = 1;
    }
    else {
      pvVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[](in_stack_fffffffffffffe60,
                            CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
      in_stack_fffffffffffffeb4 = CONCAT13(*pvVar6,(int3)in_stack_fffffffffffffeb4);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator[](in_stack_fffffffffffffe60,
                 CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
      local_30 = getPrefixMultiplier2Char(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe9e);
      pVar10.base_units_ = local_68.base_units_;
      pVar10.commodity_ = local_68.commodity_;
      pVar10.multiplier_ = local_68.multiplier_;
      pVar9._8_8_ = in_stack_fffffffffffffea0;
      pVar9.multiplier_ = in_stack_fffffffffffffea8;
      if ((local_30 != 0.0) || (NAN(local_30))) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (in_stack_fffffffffffffe78,
                   CONCAT17(in_stack_fffffffffffffe77,
                            CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)),
                   (size_type)in_stack_fffffffffffffe68);
        sVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::size(&local_50);
        if (sVar5 == 1) {
          pvVar7 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                             (in_stack_fffffffffffffe60);
          pVar3.base_units_ = local_68.base_units_;
          pVar3.commodity_ = local_68.commodity_;
          pVar3.multiplier_ = local_68.multiplier_;
          pVar9._8_8_ = in_stack_fffffffffffffea0;
          pVar9.multiplier_ = in_stack_fffffffffffffea8;
          in_stack_fffffffffffffeb0 = (int)*pvVar7;
          if (in_stack_fffffffffffffeb0 == 0x42) {
            precise_unit::precise_unit
                      ((precise_unit *)in_stack_fffffffffffffe60,
                       (double)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                       (precise_unit *)0x79c9b0);
            pVar3.base_units_ = local_68.base_units_;
            pVar3.commodity_ = local_68.commodity_;
            pVar3.multiplier_ = local_68.multiplier_;
            pVar9._8_8_ = in_stack_fffffffffffffea0;
            pVar9.multiplier_ = in_stack_fffffffffffffea8;
            local_54 = 1;
          }
          else if (in_stack_fffffffffffffeb0 == 0x62) {
            precise_unit::precise_unit
                      ((precise_unit *)in_stack_fffffffffffffe60,
                       (double)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                       (precise_unit *)0x79c9dd);
            pVar3.base_units_ = local_68.base_units_;
            pVar3.commodity_ = local_68.commodity_;
            pVar3.multiplier_ = local_68.multiplier_;
            pVar9._8_8_ = in_stack_fffffffffffffea0;
            pVar9.multiplier_ = in_stack_fffffffffffffea8;
            local_54 = 1;
          }
          else {
            if (in_stack_fffffffffffffeb0 != 0x6b) goto LAB_0079ca1f;
            local_10 = NAN;
            local_8 = 0xfa94a488;
            local_54 = 1;
          }
        }
        else {
LAB_0079ca1f:
          std::__cxx11::string::string
                    (in_stack_fffffffffffffea0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffe9f,
                              CONCAT16(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe98)));
          pVar9 = unit_quick_match((string *)
                                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                                   (uint64_t)in_stack_fffffffffffffea8);
          local_68 = pVar9;
          std::__cxx11::string::~string(in_stack_fffffffffffffe60);
          in_stack_fffffffffffffe9f =
               is_valid((precise_unit *)
                        CONCAT17(in_stack_fffffffffffffe77,
                                 CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
          if ((bool)in_stack_fffffffffffffe9f) {
            precise_unit::precise_unit
                      ((precise_unit *)in_stack_fffffffffffffe60,
                       (double)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                       (precise_unit *)0x79cabc);
            local_54 = 1;
            pVar3 = local_68;
          }
          else {
            local_54 = 0;
            pVar3 = local_68;
          }
        }
        local_68 = pVar3;
        std::__cxx11::string::~string(in_stack_fffffffffffffe60);
        pVar10 = local_68;
        if (local_54 != 0) goto LAB_0079d05f;
      }
    }
  }
  local_68 = pVar10;
  sVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (local_18);
  if (1 < sVar5) {
    pvVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             front(in_stack_fffffffffffffe60);
    local_95 = *pvVar6;
    if ((local_95 == 'N') && ((local_20 & 0x200) != 0)) {
      local_95 = 'n';
    }
    if ((local_20 & 0x100) == 0) {
      local_170 = getPrefixMultiplier(in_stack_fffffffffffffe5f);
    }
    else {
      local_170 = getStrictSIPrefixMultiplier(in_stack_fffffffffffffe5f);
    }
    local_a0 = local_170;
    if ((local_170 != 0.0) || (NAN(local_170))) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (in_stack_fffffffffffffe78,
                 CONCAT17(in_stack_fffffffffffffe77,
                          CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)),
                 (size_type)in_stack_fffffffffffffe68);
      sVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              size(&local_c0);
      if (sVar5 == 1) {
        pvVar7 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                           (in_stack_fffffffffffffe60);
        cVar1 = *pvVar7;
        if (cVar1 == 'B') {
          precise_unit::precise_unit
                    ((precise_unit *)in_stack_fffffffffffffe60,
                     (double)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                     (precise_unit *)0x79cc87);
          local_54 = 1;
        }
        else if (cVar1 == 'b') {
          precise_unit::precise_unit
                    ((precise_unit *)in_stack_fffffffffffffe60,
                     (double)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                     (precise_unit *)0x79ccb4);
          local_54 = 1;
        }
        else {
          if (cVar1 != 'k') goto LAB_0079ccf6;
          local_10 = NAN;
          local_8 = 0xfa94a488;
          local_54 = 1;
        }
      }
      else {
LAB_0079ccf6:
        std::__cxx11::string::string
                  (pVar9._8_8_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe9f,
                            CONCAT16(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe98)));
        pVar10 = unit_quick_match((string *)
                                  CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                                  (uint64_t)pVar9.multiplier_);
        in_stack_fffffffffffffe78 = pVar10._8_8_;
        std::__cxx11::string::~string(in_stack_fffffffffffffe60);
        in_stack_fffffffffffffe77 =
             is_error((precise_unit *)
                      CONCAT17(in_stack_fffffffffffffe77,
                               CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
        if ((bool)in_stack_fffffffffffffe77) {
          local_54 = 0;
        }
        else {
          precise_unit::precise_unit
                    ((precise_unit *)in_stack_fffffffffffffe60,
                     (double)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                     (precise_unit *)0x79cd93);
          local_54 = 1;
        }
      }
      std::__cxx11::string::~string(in_stack_fffffffffffffe60);
      if (local_54 != 0) goto LAB_0079d05f;
    }
  }
  if ((local_21 & 1) != 0) {
    pvVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](in_stack_fffffffffffffe60,
                        CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
    vVar12 = *pvVar6;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
              (in_stack_fffffffffffffe60,
               CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
    dVar8 = getPrefixMultiplier2Char(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe9e);
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (in_stack_fffffffffffffe78,
                 CONCAT17(in_stack_fffffffffffffe77,CONCAT16(vVar12,in_stack_fffffffffffffe70)),
                 (size_type)in_stack_fffffffffffffe68);
      bVar4 = std::operator==(in_stack_fffffffffffffe60,
                              (char *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58))
      ;
      if (bVar4) {
        precise_unit::precise_unit
                  ((precise_unit *)in_stack_fffffffffffffe60,
                   (double)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                   (precise_unit *)0x79ced9);
        pVar11._8_8_ = in_stack_fffffffffffffe60;
        pVar11.multiplier_ = in_stack_fffffffffffffe68;
        local_54 = 1;
      }
      else {
        bVar4 = std::operator==(in_stack_fffffffffffffe60,
                                (char *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58
                                                ));
        if (bVar4) {
          precise_unit::precise_unit
                    ((precise_unit *)in_stack_fffffffffffffe60,
                     (double)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                     (precise_unit *)0x79cf20);
          pVar11._8_8_ = in_stack_fffffffffffffe60;
          pVar11.multiplier_ = in_stack_fffffffffffffe68;
          local_54 = 1;
        }
        else {
          std::__cxx11::string::string
                    (pVar9._8_8_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffe9f,
                              CONCAT16(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe98)));
          pVar11 = unit_quick_match((string *)
                                    CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                                    (uint64_t)pVar9.multiplier_);
          std::__cxx11::string::~string(pVar11._8_8_);
          bVar4 = is_valid((precise_unit *)
                           CONCAT17(in_stack_fffffffffffffe77,
                                    CONCAT16(vVar12,in_stack_fffffffffffffe70)));
          if (bVar4) {
            precise_unit::precise_unit
                      (pVar11._8_8_,(double)CONCAT17(bVar4,in_stack_fffffffffffffe58),
                       (precise_unit *)0x79cfc4);
            local_54 = 1;
          }
          else {
            local_54 = 0;
          }
        }
      }
      std::__cxx11::string::~string(pVar11._8_8_);
      if (local_54 != 0) goto LAB_0079d05f;
    }
  }
  local_10 = NAN;
  local_8 = 0xfa94a488;
LAB_0079d05f:
  pVar2.base_units_ = (unit_data)(undefined4)local_8;
  pVar2.commodity_ = local_8._4_4_;
  pVar2.multiplier_ = local_10;
  return pVar2;
}

Assistant:

static precise_unit
    checkSIprefix(const std::string& unit_string, std::uint64_t match_flags)
{
    bool threeAgain{false};
    if (unit_string.size() >= 3) {
        if (unit_string[1] == 'A') {
            threeAgain = true;
        } else {
            auto mux = getPrefixMultiplier2Char(unit_string[0], unit_string[1]);
            if (mux != 0.0) {
                auto ustring = unit_string.substr(2);
                if (ustring.size() == 1) {
                    switch (ustring.front()) {
                        case 'B':
                            return {mux, precise::data::byte};
                        case 'b':
                            return {mux, precise::data::bit};
                        case 'k':
                            return precise::invalid;
                        default:
                            break;
                    }
                }

                auto retunit = unit_quick_match(ustring, match_flags);
                if (is_valid(retunit)) {
                    return {mux, retunit};
                }
            }
        }
    }
    if (unit_string.size() >= 2) {
        auto c = unit_string.front();
        if (c == 'N' && ((match_flags & case_insensitive) != 0)) {
            c = 'n';
        }
        auto mux = ((match_flags & strict_si) == 0) ?
            getPrefixMultiplier(c) :
            getStrictSIPrefixMultiplier(c);
        if (mux != 0.0) {
            auto ustring = unit_string.substr(1);
            if (ustring.size() == 1) {
                switch (ustring.front()) {
                    case 'B':
                        return {mux, precise::data::byte};
                    case 'b':
                        return {mux, precise::data::bit};
                    case 'k':
                        return precise::invalid;
                    default:
                        break;
                }
            }
            auto retunit = unit_quick_match(ustring, match_flags);
            if (!is_error(retunit)) {
                return {mux, retunit};
            }
        }
    }
    if (threeAgain) {
        auto mux = getPrefixMultiplier2Char(unit_string[0], unit_string[1]);
        if (mux != 0.0) {
            auto ustring = unit_string.substr(2);
            if (ustring == "B") {
                return {mux, precise::data::byte};
            }
            if (ustring == "b") {
                return {mux, precise::data::bit};
            }
            auto retunit = unit_quick_match(ustring, match_flags);
            if (is_valid(retunit)) {
                return {mux, retunit};
            }
        }
    }
    return precise::invalid;
}